

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emacs.c
# Opt level: O1

el_action_t em_delete_or_list(EditLine *el,wint_t c)

{
  wchar_t *pwVar1;
  el_action_t eVar2;
  
  pwVar1 = (el->el_line).cursor;
  if (pwVar1 == (el->el_line).lastchar) {
    if (pwVar1 == (el->el_line).buffer) {
      terminal_writec(el,c);
      eVar2 = '\x02';
    }
    else {
      terminal_beep(el);
      eVar2 = '\x06';
    }
  }
  else {
    if ((el->el_state).doingarg == L'\0') {
      c_delafter1(el);
    }
    else {
      c_delafter(el,(el->el_state).argument);
    }
    pwVar1 = (el->el_line).lastchar;
    eVar2 = '\x04';
    if (pwVar1 < (el->el_line).cursor) {
      (el->el_line).cursor = pwVar1;
    }
  }
  return eVar2;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
em_delete_or_list(EditLine *el, wint_t c)
{

	if (el->el_line.cursor == el->el_line.lastchar) {
					/* if I'm at the end */
		if (el->el_line.cursor == el->el_line.buffer) {
					/* and the beginning */
			terminal_writec(el, c);	/* then do an EOF */
			return CC_EOF;
		} else {
			/*
			 * Here we could list completions, but it is an
			 * error right now
			 */
			terminal_beep(el);
			return CC_ERROR;
		}
	} else {
		if (el->el_state.doingarg)
			c_delafter(el, el->el_state.argument);
		else
			c_delafter1(el);
		if (el->el_line.cursor > el->el_line.lastchar)
			el->el_line.cursor = el->el_line.lastchar;
				/* bounds check */
		return CC_REFRESH;
	}
}